

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O0

void __thiscall
CArmInstruction::CArmInstruction
          (CArmInstruction *this,tArmOpcode *sourceOpcode,ArmOpcodeVariables *vars)

{
  char *pcVar1;
  char *pcVar2;
  int64_t iVar3;
  undefined4 uVar4;
  ArmArchType AVar5;
  ArmOpcodeVariables *vars_local;
  tArmOpcode *sourceOpcode_local;
  CArmInstruction *this_local;
  
  ArmOpcodeCommand::ArmOpcodeCommand(&this->super_ArmOpcodeCommand);
  (this->super_ArmOpcodeCommand).super_CAssemblerCommand._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CArmInstruction_002a65e0;
  ArmOpcodeVariables::ArmOpcodeVariables(&this->Vars);
  pcVar1 = sourceOpcode->name;
  pcVar2 = sourceOpcode->mask;
  uVar4 = *(undefined4 *)&sourceOpcode->field_0x14;
  iVar3 = sourceOpcode->flags;
  (this->Opcode).encoding = sourceOpcode->encoding;
  *(undefined4 *)&(this->Opcode).field_0x14 = uVar4;
  (this->Opcode).flags = iVar3;
  (this->Opcode).name = pcVar1;
  (this->Opcode).mask = pcVar2;
  ArmOpcodeVariables::operator=(&this->Vars,vars);
  AVar5 = CArmArchitecture::getVersion(&Arm);
  this->arch = AVar5;
  return;
}

Assistant:

CArmInstruction::CArmInstruction(const tArmOpcode& sourceOpcode, ArmOpcodeVariables& vars)
{
	this->Opcode = sourceOpcode;
	this->Vars = vars;
	arch = Arm.getVersion();
}